

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O2

int lread(lua_State *L)

{
  rwlock *lock;
  rwlock copy;
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)lua_touserdata(L,1);
  luaL_checktype(L,2,6);
  lock = (rwlock *)*puVar2;
  rwlock_rlock(lock);
  copy = lock[2];
  if (copy != (rwlock)0x0) {
    LOCK();
    iVar1 = *(int *)copy;
    *(int *)copy = *(int *)copy + 1;
    UNLOCK();
    if (iVar1 < 1) {
      __assert_fail("ref > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-stm.c"
                    ,0x61,"struct stm_copy *stm_copy(struct stm_object *)");
    }
  }
  LOCK();
  lock->read = lock->read + -1;
  UNLOCK();
  if (copy == *(rwlock *)(puVar2 + 1)) {
    stm_releasecopy((stm_copy *)copy);
  }
  else {
    stm_releasecopy((stm_copy *)*(rwlock *)(puVar2 + 1));
    *(rwlock *)(puVar2 + 1) = copy;
    if (copy != (rwlock)0x0) {
      lua_settop(L,3);
      lua_copy(L,-1,1);
      lua_settop(L,-2);
      lua_settop(L,2);
      lua_pushlightuserdata(L,*(void **)((long)copy + 8));
      lua_pushinteger(L,(ulong)*(uint *)((long)copy + 4));
      lua_pushvalue(L,1);
      lua_callk(L,3,-1,0,(lua_KFunction)0x0);
      lua_pushboolean(L,1);
      lua_copy(L,-1,1);
      lua_settop(L,-2);
      iVar1 = lua_gettop(L);
      return iVar1;
    }
  }
  lua_pushboolean(L,0);
  return 1;
}

Assistant:

static int
lread(lua_State *L) {
	struct boxreader * box = lua_touserdata(L, 1);
	luaL_checktype(L, 2, LUA_TFUNCTION);

	struct stm_copy * copy = stm_copy(box->obj);
	if (copy == box->lastcopy) {
		// not update
		stm_releasecopy(copy);
		lua_pushboolean(L, 0);
		return 1;
	}

	stm_releasecopy(box->lastcopy);
	box->lastcopy = copy;
	if (copy) {
		lua_settop(L, 3);
		lua_replace(L, 1);
		lua_settop(L, 2);
		lua_pushlightuserdata(L, copy->msg);
		lua_pushinteger(L, copy->sz);
		lua_pushvalue(L, 1);
		lua_call(L, 3, LUA_MULTRET);
		lua_pushboolean(L, 1);
		lua_replace(L, 1);
		return lua_gettop(L);
	} else {
		lua_pushboolean(L, 0);
		return 1;
	}
}